

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_esni_init_context
              (ptls_context_t *ctx,ptls_esni_context_t *esni,ptls_iovec_t esni_keys,
              ptls_key_exchange_context_t **key_exchanges)

{
  long *plVar1;
  ushort *end;
  ushort uVar2;
  ptls_key_exchange_context_t *ppVar3;
  ushort *puVar4;
  int iVar5;
  ptls_key_exchange_context_t **pppVar6;
  ulong uVar7;
  ulong uVar8;
  ushort *puVar9;
  anon_struct_72_2_510fbff9 *paVar10;
  ulong len;
  long lVar11;
  size_t __size;
  ushort *puVar12;
  long lVar13;
  ushort *local_58;
  ushort *local_50;
  ushort *local_48;
  long local_40;
  long local_38;
  
  len = esni_keys.len;
  local_48 = (ushort *)esni_keys.base;
  __size = 0;
  do {
    plVar1 = (long *)((long)key_exchanges + __size);
    __size = __size + 8;
  } while (*plVar1 != 0);
  esni->not_before = 0;
  esni->not_after = 0;
  esni->cipher_suites = (anon_struct_72_2_510fbff9 *)0x0;
  *(undefined8 *)&esni->padded_length = 0;
  *(undefined8 *)&esni->version = 0;
  pppVar6 = (ptls_key_exchange_context_t **)malloc(__size);
  esni->key_exchanges = pppVar6;
  iVar5 = 0x201;
  if (pppVar6 != (ptls_key_exchange_context_t **)0x0) {
    memcpy(pppVar6,key_exchanges,__size);
    if (1 < (long)len) {
      esni->version = *local_48 << 8 | *local_48 >> 8;
      if (len < 6) {
        iVar5 = 0x33;
        goto LAB_00111ad1;
      }
      if (((len & 0x7ffffffffffffffe) != 6) &&
         (uVar7 = (ulong)(ushort)(local_48[3] << 8 | local_48[3] >> 8), uVar7 <= len - 8)) {
        end = (ushort *)((long)local_48 + len);
        puVar12 = (ushort *)((long)local_48 + uVar7 + 8);
        if (1 < (ulong)((long)end - (long)puVar12)) {
          uVar2 = *puVar12;
          uVar8 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
          puVar12 = (ushort *)((long)local_48 + uVar7 + 10);
          if (uVar8 <= (ulong)((long)end - (long)puVar12)) {
            puVar9 = (ushort *)(uVar8 + (long)puVar12);
            do {
              if (((long)puVar9 - (long)puVar12 < 2) || (((long)puVar9 - (long)puVar12) - 2U < 2))
              goto LAB_00111ab4;
              uVar7 = (ulong)(ushort)(puVar12[1] << 8 | puVar12[1] >> 8);
              if ((ulong)((long)puVar9 - (long)(puVar12 + 2)) < uVar7) goto LAB_00111ab4;
              uVar2 = *puVar12;
              puVar12 = (ushort *)((long)(puVar12 + 2) + uVar7);
              pppVar6 = key_exchanges;
              do {
                ppVar3 = *pppVar6;
                if (ppVar3 == (ptls_key_exchange_context_t *)0x0) break;
                pppVar6 = pppVar6 + 1;
              } while (ppVar3->algo->id != (uint16_t)(uVar2 << 8 | uVar2 >> 8));
            } while (puVar12 != puVar9);
            if (1 < (ulong)((long)end - (long)puVar9)) {
              uVar7 = (ulong)(ushort)(*puVar12 << 8 | *puVar12 >> 8);
              puVar12 = puVar12 + 1;
              local_58 = puVar12;
              if (uVar7 <= (ulong)((long)end - (long)puVar12)) {
                puVar9 = (ushort *)(uVar7 + (long)puVar12);
                paVar10 = (anon_struct_72_2_510fbff9 *)0x0;
                lVar13 = 0;
                local_50 = puVar9;
                do {
                  if ((long)puVar9 - (long)puVar12 < 2) goto LAB_00111ab4;
                  uVar2 = *puVar12;
                  puVar12 = puVar12 + 1;
                  for (lVar11 = 0; puVar4 = *(ushort **)((long)ctx->cipher_suites + lVar11),
                      puVar4 != (ushort *)0x0; lVar11 = lVar11 + 8) {
                    if (*puVar4 == (ushort)(uVar2 << 8 | uVar2 >> 8)) {
                      local_38 = lVar13 + 1;
                      local_40 = lVar13;
                      paVar10 = (anon_struct_72_2_510fbff9 *)realloc(paVar10,local_38 * 0x48);
                      if (paVar10 == (anon_struct_72_2_510fbff9 *)0x0) goto LAB_00111ad1;
                      esni->cipher_suites = paVar10;
                      paVar10[local_40].cipher_suite =
                           *(ptls_cipher_suite_t **)((long)ctx->cipher_suites + lVar11);
                      puVar9 = local_50;
                      lVar13 = local_38;
                      break;
                    }
                  }
                } while (puVar12 != puVar9);
                paVar10 = (anon_struct_72_2_510fbff9 *)realloc(paVar10,lVar13 * 0x48 + 0x48);
                if (paVar10 != (anon_struct_72_2_510fbff9 *)0x0) {
                  esni->cipher_suites = paVar10;
                  paVar10[lVar13].cipher_suite = (ptls_cipher_suite_t *)0x0;
                  if (1 < (long)end - (long)local_50) {
                    esni->padded_length = *local_50 << 8 | *local_50 >> 8;
                    local_58 = local_50 + 1;
                    iVar5 = ptls_decode64(&esni->not_before,(uint8_t **)&local_58,(uint8_t *)end);
                    if ((iVar5 != 0) ||
                       (iVar5 = ptls_decode64(&esni->not_after,(uint8_t **)&local_58,(uint8_t *)end)
                       , iVar5 != 0)) goto LAB_00111ad1;
                    if (1 < (ulong)((long)end - (long)local_58)) {
                      uVar7 = (ulong)(ushort)(*local_58 << 8 | *local_58 >> 8);
                      puVar12 = local_58 + 1;
                      if (uVar7 <= (ulong)((long)end - (long)puVar12)) {
                        puVar9 = (ushort *)(uVar7 + (long)puVar12);
                        for (; puVar12 != puVar9; puVar12 = (ushort *)((long)(puVar12 + 2) + uVar7))
                        {
                          if (((long)puVar9 - (long)puVar12 < 2) ||
                             (((long)puVar9 - (long)puVar12) - 2U < 2)) goto LAB_00111cb5;
                          uVar7 = (ulong)(ushort)(puVar12[1] << 8 | puVar12[1] >> 8);
                          if ((ulong)((long)puVar9 - (long)(puVar12 + 2)) < uVar7)
                          goto LAB_00111cb5;
                        }
                        iVar5 = 0x32;
                        if (puVar9 == end) {
                          lVar13 = 8;
                          do {
                            lVar11 = *(long *)(esni->cipher_suites->record_digest + lVar13 + -0x10);
                            if (lVar11 == 0) {
                              return 0;
                            }
                            iVar5 = ptls_calc_hash(*(ptls_hash_algorithm_t **)(lVar11 + 0x10),
                                                   esni->cipher_suites->record_digest + lVar13 + -8,
                                                   local_48,len);
                            lVar13 = lVar13 + 0x48;
                          } while (iVar5 == 0);
                        }
                        goto LAB_00111ad1;
                      }
                    }
                  }
LAB_00111cb5:
                  iVar5 = 0x32;
                }
                goto LAB_00111ad1;
              }
            }
          }
        }
      }
    }
LAB_00111ab4:
    iVar5 = 0x32;
  }
LAB_00111ad1:
  ptls_esni_dispose_context(esni);
  return iVar5;
}

Assistant:

int ptls_esni_init_context(ptls_context_t *ctx, ptls_esni_context_t *esni, ptls_iovec_t esni_keys,
                           ptls_key_exchange_context_t **key_exchanges)
{
    const uint8_t *src = esni_keys.base, *const end = src + esni_keys.len;
    size_t num_key_exchanges, num_cipher_suites = 0;
    int ret;

    for (num_key_exchanges = 0; key_exchanges[num_key_exchanges] != NULL; ++num_key_exchanges)
        ;

    memset(esni, 0, sizeof(*esni));
    if ((esni->key_exchanges = malloc(sizeof(*esni->key_exchanges) * (num_key_exchanges + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(esni->key_exchanges, key_exchanges, sizeof(*esni->key_exchanges) * (num_key_exchanges + 1));

    /* ESNIKeys */
    if ((ret = ptls_decode16(&esni->version, &src, end)) != 0)
        goto Exit;
    /* Skip checksum fields */
    if (end - src < 4) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    src += 4;
    /* Published SNI field */
    ptls_decode_open_block(src, end, 2, { src = end; });

    /* Process the list of KeyShareEntries, verify for each of them that the ciphersuite is supported. */
    ptls_decode_open_block(src, end, 2, {
        do {
            /* parse */
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
            /* check that matching key-share exists */
            ptls_key_exchange_context_t **found;
            for (found = key_exchanges; *found != NULL; ++found)
                if ((*found)->algo->id == id)
                    break;
            if (found == NULL) {
                ret = PTLS_ERROR_INCOMPATIBLE_KEY;
                goto Exit;
            }
        } while (src != end);
    });
    /* Process the list of cipher_suites. If they are supported, store in esni context  */
    ptls_decode_open_block(src, end, 2, {
        void *newp;
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            size_t i;
            for (i = 0; ctx->cipher_suites[i] != NULL; ++i)
                if (ctx->cipher_suites[i]->id == id)
                    break;
            if (ctx->cipher_suites[i] != NULL) {
                if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                esni->cipher_suites = newp;
                esni->cipher_suites[num_cipher_suites++].cipher_suite = ctx->cipher_suites[i];
            }
        } while (src != end);
        if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        esni->cipher_suites = newp;
        esni->cipher_suites[num_cipher_suites].cipher_suite = NULL;
    });
    /* Parse the padded length, not before, not after parameters */
    if ((ret = ptls_decode16(&esni->padded_length, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_before, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_after, &src, end)) != 0)
        goto Exit;
    /* Skip the extension fields */
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t ext_type;
            if ((ret = ptls_decode16(&ext_type, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    { /* calculate digests for every cipher-suite */
        size_t i;
        for (i = 0; esni->cipher_suites[i].cipher_suite != NULL; ++i) {
            if ((ret = ptls_calc_hash(esni->cipher_suites[i].cipher_suite->hash, esni->cipher_suites[i].record_digest,
                                      esni_keys.base, esni_keys.len)) != 0)
                goto Exit;
        }
    }

    ret = 0;
Exit:
    if (ret != 0)
        ptls_esni_dispose_context(esni);
    return ret;
}